

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu.c
# Opt level: O0

nsync_dll_list_ nsync::nsync_remove_from_mu_queue_(nsync_dll_list_ mu_queue,nsync_dll_element_ *e)

{
  nsync_dll_element_ *p;
  nsync_dll_element_ *n;
  void *pvVar1;
  uint o;
  int iVar2;
  nsync_dll_list_ list;
  long *plVar3;
  nsync_dll_element_ *pnVar4;
  nsync_dll_element_ *e_same_condition;
  uint32_t old_value;
  nsync_dll_element_ *next;
  nsync_dll_element_ *prev;
  nsync_dll_element_ *e_local;
  nsync_dll_list_ mu_queue_local;
  
  p = e->prev;
  n = e->next;
  list = nsync_dll_remove_(mu_queue,e);
  do {
    o = std::atomic_load_explicit<unsigned_int>
                  ((atomic<unsigned_int> *)((long)e->container + 0x48),memory_order_relaxed);
    iVar2 = atm_cas_nomb_u32_((nsync_atomic_uint32_ *)((long)e->container + 0x48),o,o + 1);
  } while (iVar2 == 0);
  iVar2 = nsync_dll_is_empty_(list);
  if (iVar2 == 0) {
    pvVar1 = e->container;
    plVar3 = (long *)((long)pvVar1 + 0x68);
    if ((long *)*plVar3 == plVar3) {
      pnVar4 = nsync_dll_last_(list);
      if (p != pnVar4) {
        nsync_maybe_merge_conditions_(p,n);
      }
    }
    else {
      *(undefined8 *)(*plVar3 + 8) = *(undefined8 *)((long)pvVar1 + 0x70);
      **(long **)((long)pvVar1 + 0x70) = *plVar3;
      *plVar3 = (long)plVar3;
      *(long **)((long)pvVar1 + 0x70) = plVar3;
    }
  }
  return list;
}

Assistant:

nsync_dll_list_ nsync_remove_from_mu_queue_ (nsync_dll_list_ mu_queue, nsync_dll_element_ *e) {
	/* Record previous and next elements in the original queue. */
	nsync_dll_element_ *prev = e->prev;
	nsync_dll_element_ *next = e->next;
	uint32_t old_value;
	/* Remove. */
	mu_queue = nsync_dll_remove_ (mu_queue, e);
        do {    
                old_value = ATM_LOAD (&DLL_WAITER (e)->remove_count);
        } while (!ATM_CAS (&DLL_WAITER (e)->remove_count, old_value, old_value+1));
	if (!nsync_dll_is_empty_ (mu_queue)) {
		/* Fix up same_condition. */
		nsync_dll_element_ *e_same_condition = &DLL_WAITER (e)->same_condition;

		if (e_same_condition->next != e_same_condition) {
			/* *e is linked to a same_condition neighbour---just remove it. */
			e_same_condition->next->prev = e_same_condition->prev;
			e_same_condition->prev->next = e_same_condition->next;
			e_same_condition->next = e_same_condition;
			e_same_condition->prev = e_same_condition;
		} else if (prev != nsync_dll_last_ (mu_queue)) {
			/* Merge the new neighbours together if we can. */
			nsync_maybe_merge_conditions_ (prev, next);
		}
	}
	return (mu_queue);
}